

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation_engine.cpp
# Opt level: O0

void __thiscall cppurses::Animation_engine::startup(Animation_engine *this)

{
  bool bVar1;
  reference ppVar2;
  reference this_00;
  pointer pTVar3;
  unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
  *loop;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
  *__range1_1;
  pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::hash<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::equal_to<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
  *__range1;
  Animation_engine *this_local;
  
  __end1 = std::
           unordered_map<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::hash<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::equal_to<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
           ::begin(&this->const_loops_);
  pair = (pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>
          *)std::
            unordered_map<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::hash<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::equal_to<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
            ::end(&this->const_loops_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>,_false>
                         *)&pair);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>,_false,_false>
             ::operator*(&__end1);
    pTVar3 = std::
             unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
             ::operator->(&ppVar2->second);
    Event_loop::run_async(&pTVar3->super_Event_loop);
    std::__detail::
    _Node_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
             ::begin(&this->variable_loops_);
  loop = (unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
          *)std::
            vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
            ::end(&this->variable_loops_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_*,_std::vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
                        *)&loop);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_*,_std::vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
              ::operator*(&__end1_1);
    pTVar3 = std::
             unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
             ::operator->(this_00);
    Event_loop::run_async(&pTVar3->super_Event_loop);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_*,_std::vector<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void Animation_engine::startup()
{
    for (auto& pair : const_loops_) {
        pair.second->run_async();
    }
    for (auto& loop : variable_loops_) {
        loop->run_async();
    }
}